

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cpp
# Opt level: O2

string * duckdb::FileSystem::GetWorkingDirectory_abi_cxx11_(void)

{
  unique_ptr<char[],_std::default_delete<char[]>_> __buf;
  char *pcVar1;
  IOException *this;
  string *in_RDI;
  allocator local_41;
  unique_ptr<char[],_std::default_delete<char>,_false> buffer;
  string local_38;
  
  __buf._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
                 operator_new__(0x1000);
  switchD_016d4fed::default
            ((void *)__buf._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                     super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                     super__Head_base<0UL,_char_*,_false>._M_head_impl,0,0x1000);
  buffer.super_unique_ptr<char[],_std::default_delete<char[]>_>._M_t.
  super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (unique_ptr<char[],_std::default_delete<char[]>_>)
                 (unique_ptr<char[],_std::default_delete<char[]>_>)
                 __buf._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                 super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                 super__Head_base<0UL,_char_*,_false>._M_head_impl;
  pcVar1 = getcwd((char *)__buf._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                          super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                          super__Head_base<0UL,_char_*,_false>._M_head_impl,0x1000);
  if (pcVar1 != (char *)0x0) {
    ::std::__cxx11::string::string
              ((string *)in_RDI,
               (char *)__buf._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                       super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                       super__Head_base<0UL,_char_*,_false>._M_head_impl,(allocator *)&local_38);
    ::std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
              (&buffer.super_unique_ptr<char[],_std::default_delete<char[]>_>);
    return in_RDI;
  }
  this = (IOException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_38,"Could not get working directory!",&local_41);
  IOException::IOException(this,&local_38);
  __cxa_throw(this,&IOException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

string FileSystem::GetWorkingDirectory() {
	auto buffer = make_unsafe_uniq_array<char>(PATH_MAX);
	char *ret = getcwd(buffer.get(), PATH_MAX);
	if (!ret) {
		throw IOException("Could not get working directory!");
	}
	return string(buffer.get());
}